

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::~ConstantPaddingLayerParams
          (ConstantPaddingLayerParams *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((uVar1 & 1) != 0) && (*(long *)(uVar1 & 0xfffffffffffffffc) == 0)) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (this_00);
  }
  google::protobuf::RepeatedField<unsigned_long>::~RepeatedField(&this->padamounts_);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

ConstantPaddingLayerParams::~ConstantPaddingLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ConstantPaddingLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}